

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::FieldDescriptor::DebugString
          (FieldDescriptor *this,int depth,string *contents,DebugStringOptions *debug_string_options
          )

{
  OneofDescriptor *pOVar1;
  ushort *puVar2;
  char *pcVar3;
  FeatureSet *from;
  KeyValue *pKVar4;
  _Alloc_hider _Var5;
  AllocatedData AVar6;
  byte bVar7;
  bool bVar8;
  Descriptor *pDVar9;
  DescriptorNames *pDVar10;
  Nonnull<char_*> pcVar11;
  Nonnull<const_char_*> pcVar12;
  bool bVar13;
  undefined1 *puVar14;
  AllocatedData *pAVar15;
  uint value;
  int iVar16;
  ulong uVar17;
  undefined4 in_register_00000034;
  AllocatedData AVar18;
  size_t in_R9;
  string_view format;
  string_view format_00;
  string_view format_01;
  string_view src;
  string formatted_options;
  string prefix;
  string label;
  string field_type;
  SourceLocationCommentPrinter comment_printer;
  FieldOptions full_options;
  AllocatedData local_218;
  AllocatedData local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208 [2];
  KeyValue *local_1e8;
  KeyValue *local_1e0;
  long local_1d8 [2];
  string local_1c8;
  undefined1 *local_1a8;
  undefined8 local_1a0;
  undefined1 local_198;
  undefined7 uStack_197;
  undefined8 local_188;
  size_type local_180;
  AllocatedData local_178;
  undefined8 local_170;
  AllocatedData local_168;
  AllocatedData local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  size_type local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  _Alloc_hider local_130;
  size_type local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_110;
  DebugStringOptions local_f8 [2];
  _Alloc_hider local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  AllocatedData local_c8;
  AllocatedData local_c0;
  AllocatedData local_b8;
  pointer local_b0;
  undefined8 local_a8;
  undefined1 *local_a0;
  ulong local_98;
  long local_90;
  AllocatedData local_88;
  AllocatedData local_80;
  FeatureSet *local_58;
  uint local_48;
  
  local_170 = CONCAT44(in_register_00000034,depth);
  local_1e8 = (KeyValue *)local_1d8;
  std::__cxx11::string::_M_construct((ulong)&local_1e8,(char)depth * '\x02');
  local_1a8 = &local_198;
  local_1a0 = 0;
  local_198 = 0;
  if ((this->type_ == '\v') &&
     (pDVar9 = message_type(this), (pDVar9->options_->field_0)._impl_.map_entry_ == true)) {
    pDVar9 = message_type(this);
    if ((long)pDVar9->field_count_ < 1) {
      pcVar12 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                          (0,(long)pDVar9->field_count_,"index < field_count()");
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_168,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                 ,0xa88,pcVar12);
      goto LAB_001c5cca;
    }
    FieldTypeNameDebugString_abi_cxx11_((string *)&local_c8,pDVar9->fields_);
    AVar6 = local_c0;
    AVar18 = local_c8;
    pDVar9 = message_type(this);
    if ((long)pDVar9->field_count_ < 2) {
      pcVar12 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                          (1,(long)pDVar9->field_count_,"index < field_count()");
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_168,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                 ,0xa88,pcVar12);
      goto LAB_001c5cca;
    }
    FieldTypeNameDebugString_abi_cxx11_((string *)&local_218,pDVar9->fields_ + 1);
    local_168 = AVar6;
    local_160.flat = AVar18.flat;
    local_158._M_allocated_capacity = (size_type)local_210;
    local_158._8_8_ = local_218;
    format._M_str = (char *)&local_168;
    format._M_len = (size_t)"map<$0, $1>";
    absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
              ((substitute_internal *)&local_1a8,(Nonnull<std::string_*>)0xb,format,
               (Nullable<const_absl::string_view_*>)0x2,in_R9);
    if (local_218.flat != (KeyValue *)local_208) {
      operator_delete(local_218.flat,
                      CONCAT71(local_208[0]._M_allocated_capacity._1_7_,local_208[0]._M_local_buf[0]
                              ) + 1);
    }
    if ((AllocatedData *)local_c8.flat != &local_b8) goto LAB_001c553b;
  }
  else {
    FieldTypeNameDebugString_abi_cxx11_((string *)&local_168,this);
    std::__cxx11::string::operator=((string *)&local_1a8,(string *)&local_168);
    local_b8 = (AllocatedData)local_158._M_allocated_capacity;
    local_c8 = local_168;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168.flat != &local_158) {
LAB_001c553b:
      operator_delete(local_c8.flat,(long)local_b8.flat + 1);
    }
  }
  puVar14 = kLabelToName;
  AVar18 = (AllocatedData)
           ((AllocatedData *)(kLabelToName + (ulong)((byte)this->field_0x1 >> 6) * 8))->flat;
  local_168 = (AllocatedData)strlen((char *)AVar18.flat);
  local_c8 = (AllocatedData)0x1;
  local_c0.flat = (KeyValue *)0x393b5a;
  local_160 = AVar18;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_1c8,(lts_20250127 *)&local_168,(AlphaNum *)&local_c8,(AlphaNum *)puVar14);
  if ((this->type_ == '\v') &&
     (pDVar9 = message_type(this), (pDVar9->options_->field_0)._impl_.map_entry_ != false)) {
LAB_001c563c:
    local_1c8._M_string_length = 0;
    *local_1c8._M_dataplus._M_p = '\0';
  }
  else {
    if ((this->field_0x3 & 1) != 0) {
      if ((this->field_0x1 & 0x10) == 0) {
        iVar16 = 0xb63;
LAB_001c5d02:
        internal::protobuf_assumption_failed
                  ("res != nullptr",
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,iVar16);
      }
      pOVar1 = (this->scope_).containing_oneof;
      if (pOVar1 == (OneofDescriptor *)0x0) {
        iVar16 = 0xb31;
        goto LAB_001c5d02;
      }
      if ((pOVar1->field_count_ == 1) && ((pOVar1->fields_->field_0x1 & 2) != 0)) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_168,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xb64,"!res->is_synthetic()");
        goto LAB_001c5cca;
      }
      goto LAB_001c563c;
    }
    if ((this->merged_features_->field_0)._impl_.field_presence_ != 3) {
      bVar7 = this->field_0x1;
      bVar13 = (bool)((bVar7 & 0x20) >> 5);
      if (0xbf < bVar7 != bVar13) {
        pcVar12 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                            (bVar13,0xbf < bVar7,
                             "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_168,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xb54,pcVar12);
        goto LAB_001c5cca;
      }
      if (((bVar7 & 0x20) == 0) && (bVar13 = has_optional_keyword(this), !bVar13))
      goto LAB_001c563c;
    }
  }
  bVar7 = this->field_0x1;
  bVar13 = (bool)((bVar7 & 0x20) >> 5);
  if (0xbf < bVar7 != bVar13) {
    pcVar12 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                        (bVar13,0xbf < bVar7,
                         "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_168,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
               ,0xb54,pcVar12);
LAB_001c5cca:
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_168);
  }
  if (((bVar7 & 0x20) == 0) && (999 < (int)this->file_->edition_)) {
    local_1c8._M_string_length = 0;
    *local_1c8._M_dataplus._M_p = '\0';
  }
  local_158._8_8_ = &local_140;
  local_148 = 0;
  local_140._M_local_buf[0] = '\0';
  local_130._M_p = (pointer)&local_120;
  local_128 = 0;
  local_120._M_local_buf[0] = '\0';
  local_110.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_110.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_110.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8[0].include_comments = debug_string_options->include_comments;
  local_f8[0].elide_group_body = debug_string_options->elide_group_body;
  local_f8[0].elide_oneof_body = debug_string_options->elide_oneof_body;
  local_f0._M_p = (pointer)&local_e0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f0,local_1e8,
             (Nonnull<char_*>)
             ((long)&local_1e8->second + (long)&local_1e0->second + 0xfffffffffffffff0U));
  if (debug_string_options->include_comments == true) {
    bVar13 = GetSourceLocation(this,(SourceLocation *)&local_160);
  }
  else {
    bVar13 = false;
  }
  local_168._0_1_ = bVar13;
  anon_unknown_24::SourceLocationCommentPrinter::AddPreComment
            ((SourceLocationCommentPrinter *)&local_168,contents);
  puVar14 = local_1a8;
  _Var5._M_p = local_1c8._M_dataplus._M_p;
  pKVar4 = local_1e8;
  local_178.flat = local_1e0;
  local_180 = local_1c8._M_string_length;
  local_188 = local_1a0;
  if (((int)this->file_->edition_ < 1000) && (this->type_ == '\n')) {
    pDVar9 = message_type(this);
    pDVar10 = &pDVar9->all_names_;
  }
  else {
    pDVar10 = &this->all_names_;
  }
  puVar2 = (ushort *)pDVar10->payload_;
  uVar17 = (ulong)*puVar2;
  pcVar11 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                      (this->number_,local_208[0]._M_local_buf);
  local_90 = (long)puVar2 + ~uVar17;
  local_218.flat = (KeyValue *)(pcVar11 + -(long)local_208);
  pAVar15 = &local_c8;
  local_c8 = local_178;
  local_c0.flat = pKVar4;
  local_b8 = (AllocatedData)local_180;
  local_b0 = _Var5._M_p;
  local_a8 = local_188;
  local_a0 = puVar14;
  format_00._M_str = (char *)pAVar15;
  format_00._M_len = (size_t)"$0$1$2 $3 = $4";
  local_210 = (AllocatedData)local_208;
  local_98 = uVar17;
  local_88.flat = local_218.flat;
  local_80 = (AllocatedData)local_208;
  absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
            ((substitute_internal *)contents,(Nonnull<std::string_*>)0xe,format_00,
             (Nullable<const_absl::string_view_*>)&DAT_00000005,in_R9);
  bVar7 = this->field_0x1;
  if ((bVar7 & 1) == 0) {
    bVar13 = false;
  }
  else {
    DefaultValueAsString_abi_cxx11_((string *)&local_c8,this,true);
    pAVar15 = &local_218;
    local_218.flat = local_c0.flat;
    local_210.flat = local_c8.flat;
    format_01._M_str = (char *)pAVar15;
    format_01._M_len = (size_t)" [default = $0";
    absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
              ((substitute_internal *)contents,(Nonnull<std::string_*>)0xe,format_01,
               (Nullable<const_absl::string_view_*>)0x1,in_R9);
    if ((AllocatedData *)local_c8.flat != &local_b8) {
      operator_delete(local_c8.flat,(long)local_b8 + 1);
    }
    bVar7 = this->field_0x1;
    bVar13 = true;
  }
  if ((bVar7 & 4) != 0) {
    if (bVar13) {
      std::__cxx11::string::append((char *)contents);
    }
    else {
      bVar13 = true;
      std::__cxx11::string::append((char *)contents);
    }
    std::__cxx11::string::append((char *)contents);
    pcVar3 = (this->all_names_).payload_;
    src._M_len = (long)pcVar3 - (ulong)*(ushort *)(pcVar3 + 0xc);
    src._M_str = (char *)pAVar15;
    absl::lts_20250127::CEscape_abi_cxx11_
              ((string *)&local_c8,(lts_20250127 *)(ulong)*(ushort *)(pcVar3 + 0xe),src);
    std::__cxx11::string::_M_append((char *)contents,(ulong)local_c8);
    if ((AllocatedData *)local_c8.flat != &local_b8) {
      operator_delete(local_c8.flat,(long)local_b8 + 1);
    }
    std::__cxx11::string::append((char *)contents);
  }
  FieldOptions::FieldOptions((FieldOptions *)&local_c8,(Arena *)0x0,this->options_);
  from = this->proto_features_;
  if (from != (FeatureSet *)_FeatureSet_default_instance_) {
    local_a0 = (undefined1 *)((ulong)local_a0 | 1);
    if (local_58 == (FeatureSet *)0x0) {
      AVar18 = local_c0;
      if (((ulong)local_c0 & 1) != 0) {
        AVar18 = *(AllocatedData *)((ulong)local_c0 & 0xfffffffffffffffe);
      }
      local_58 = (FeatureSet *)
                 Arena::DefaultConstruct<google::protobuf::FeatureSet>((Arena *)AVar18.flat);
    }
    FeatureSet::CopyFrom(local_58,from);
  }
  if ((~this->field_0x3 & 6) != 0) {
    value = (byte)this->field_0x3 >> 1 & 3;
    bVar8 = internal::ValidateEnum(value,(uint32_t *)&FieldOptions_CType_internal_data_);
    if (!bVar8) {
      __assert_fail("::google::protobuf::internal::ValidateEnum( value, ::google::protobuf::FieldOptions_CType_internal_data_)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.h"
                    ,0x4804,
                    "void google::protobuf::FieldOptions::_internal_set_ctype(::google::protobuf::FieldOptions_CType)"
                   );
    }
    local_a0 = (undefined1 *)((ulong)local_a0 | 4);
    local_48 = value;
  }
  local_210 = (AllocatedData)0x0;
  local_208[0]._M_local_buf[0] = '\0';
  iVar16 = (int)local_170;
  local_218 = (AllocatedData)local_208;
  bVar8 = anon_unknown_24::FormatBracketedOptions
                    (iVar16,(Message *)&local_c8,this->file_->pool_,(string *)&local_218);
  if (bVar8) {
    std::__cxx11::string::append((char *)contents);
    std::__cxx11::string::_M_append((char *)contents,(ulong)local_218);
  }
  else if (!bVar13) goto LAB_001c5a87;
  std::__cxx11::string::append((char *)contents);
LAB_001c5a87:
  if ((((int)this->file_->edition_ < 1000) && (this->type_ == '\n')) &&
     (debug_string_options->elide_group_body == false)) {
    pDVar9 = message_type(this);
    Descriptor::DebugString(pDVar9,iVar16,contents,debug_string_options,false);
  }
  else {
    std::__cxx11::string::append((char *)contents);
  }
  anon_unknown_24::SourceLocationCommentPrinter::AddPostComment
            ((SourceLocationCommentPrinter *)&local_168,contents);
  if (local_218.flat != (KeyValue *)local_208) {
    operator_delete(local_218.flat,
                    CONCAT71(local_208[0]._M_allocated_capacity._1_7_,local_208[0]._M_local_buf[0])
                    + 1);
  }
  FieldOptions::~FieldOptions((FieldOptions *)&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_p != &local_e0) {
    operator_delete(local_f0._M_p,local_e0._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_p != &local_120) {
    operator_delete(local_130._M_p,
                    CONCAT71(local_120._M_allocated_capacity._1_7_,local_120._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._8_8_ != &local_140) {
    operator_delete((void *)local_158._8_8_,
                    CONCAT71(local_140._M_allocated_capacity._1_7_,local_140._M_local_buf[0]) + 1);
  }
  if (local_1c8._M_dataplus._M_p != (pointer)((long)&local_1c8 + 0x10)) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if (local_1a8 != &local_198) {
    operator_delete(local_1a8,CONCAT71(uStack_197,local_198) + 1);
  }
  if (local_1e8 != (KeyValue *)local_1d8) {
    operator_delete(local_1e8,local_1d8[0] + 1);
  }
  return;
}

Assistant:

void FieldDescriptor::DebugString(
    int depth, std::string* contents,
    const DebugStringOptions& debug_string_options) const {
  std::string prefix(depth * 2, ' ');
  std::string field_type;

  // Special case map fields.
  if (is_map()) {
    absl::SubstituteAndAppend(
        &field_type, "map<$0, $1>",
        message_type()->field(0)->FieldTypeNameDebugString(),
        message_type()->field(1)->FieldTypeNameDebugString());
  } else {
    field_type = FieldTypeNameDebugString();
  }

  std::string label =
      absl::StrCat(kLabelToName[static_cast<Label>(label_)], " ");

  // Label is omitted for maps, oneof, and plain proto3 fields.
  if (is_map() || real_containing_oneof() ||
      (!is_required() && !is_repeated() && !has_optional_keyword())) {
    label.clear();
  }
  // Label is omitted for optional and required fields under editions.
  if (!is_repeated() && !IsLegacyEdition(file()->edition())) {
    label.clear();
  }

  SourceLocationCommentPrinter comment_printer(this, prefix,
                                               debug_string_options);
  comment_printer.AddPreComment(contents);

  absl::SubstituteAndAppend(
      contents, "$0$1$2 $3 = $4", prefix, label, field_type,
      IsGroupSyntax(file()->edition(), this) ? message_type()->name() : name(),
      number());

  bool bracketed = false;
  if (has_default_value()) {
    bracketed = true;
    absl::SubstituteAndAppend(contents, " [default = $0",
                              DefaultValueAsString(true));
  }
  if (has_json_name_) {
    if (!bracketed) {
      bracketed = true;
      contents->append(" [");
    } else {
      contents->append(", ");
    }
    contents->append("json_name = \"");
    contents->append(absl::CEscape(json_name()));
    contents->append("\"");
  }

  FieldOptions full_options = options();
  CopyFeaturesToOptions(proto_features_, &full_options);
  if (has_legacy_proto_ctype()) {
    full_options.set_ctype(
        static_cast<FieldOptions::CType>(legacy_proto_ctype()));
  }
  std::string formatted_options;
  if (FormatBracketedOptions(depth, full_options, file()->pool(),
                             &formatted_options)) {
    contents->append(bracketed ? ", " : " [");
    bracketed = true;
    contents->append(formatted_options);
  }

  if (bracketed) {
    contents->append("]");
  }

  if (IsGroupSyntax(file()->edition(), this)) {
    if (debug_string_options.elide_group_body) {
      contents->append(" { ... };\n");
    } else {
      message_type()->DebugString(depth, contents, debug_string_options,
                                  /* include_opening_clause */ false);
    }
  } else {
    contents->append(";\n");
  }

  comment_printer.AddPostComment(contents);
}